

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

int Abc_NodeIsOr2(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  byte local_21;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode_local;
  
  pNtk_00 = pNode->pNtk;
  iVar1 = Abc_NtkIsNetlist(pNtk_00);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                  ,0x3a2,"int Abc_NodeIsOr2(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 != 0) {
    iVar1 = Abc_ObjFaninNum(pNode);
    if (iVar1 == 2) {
      iVar1 = Abc_NtkHasSop(pNtk_00);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                      ,0x3ac,"int Abc_NodeIsOr2(Abc_Obj_t *)");
      }
      iVar1 = Abc_SopIsOrType((char *)(pNode->field_5).pData);
      local_21 = 1;
      if (iVar1 == 0) {
        iVar1 = strcmp((char *)(pNode->field_5).pData,"01 0\n");
        local_21 = 1;
        if (iVar1 != 0) {
          iVar1 = strcmp((char *)(pNode->field_5).pData,"10 0\n");
          local_21 = 1;
          if (iVar1 != 0) {
            iVar1 = strcmp((char *)(pNode->field_5).pData,"00 0\n");
            local_21 = iVar1 != 0 ^ 0xff;
          }
        }
      }
      pNode_local._4_4_ = (uint)(local_21 & 1);
    }
    else {
      pNode_local._4_4_ = 0;
    }
    return pNode_local._4_4_;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                ,0x3a3,"int Abc_NodeIsOr2(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeIsOr2( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    if ( Abc_ObjFaninNum(pNode) != 2 )
        return 0;
    if ( Abc_NtkHasSop(pNtk) )
    return ( Abc_SopIsOrType(((char *)pNode->pData))   || 
         !strcmp(((char *)pNode->pData), "01 0\n") ||
         !strcmp(((char *)pNode->pData), "10 0\n") ||
         !strcmp(((char *)pNode->pData), "00 0\n") );
         //off-sets, too
    assert( 0 );
    return 0;
}